

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cswTable.c
# Opt level: O2

int Csw_TableCountCuts(Csw_Man_t *p)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  Csw_Cut_t *pCVar4;
  
  uVar3 = 0;
  uVar2 = (ulong)(uint)p->nTableSize;
  if (p->nTableSize < 1) {
    uVar2 = uVar3;
  }
  iVar1 = 0;
  for (; uVar3 != uVar2; uVar3 = uVar3 + 1) {
    pCVar4 = (Csw_Cut_t *)(p->pTable + uVar3);
    iVar1 = iVar1 + -1;
    do {
      pCVar4 = pCVar4->pNext;
      iVar1 = iVar1 + 1;
    } while (pCVar4 != (Csw_Cut_t *)0x0);
  }
  return iVar1;
}

Assistant:

int Csw_TableCountCuts( Csw_Man_t * p )
{
    Csw_Cut_t * pEnt;
    int i, Counter = 0;
    for ( i = 0; i < p->nTableSize; i++ )
        for ( pEnt = p->pTable[i]; pEnt; pEnt = pEnt->pNext )
            Counter++;
    return Counter;
}